

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

iterator fmt::v5::format_to<char[5],long,char_const*,500ul,char>
                   (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf,
                   char (*format_str) [5],long *args,char **args_1)

{
  iterator iVar1;
  basic_string_view<char> format_str_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_long,_const_char_*>
  as;
  long local_38 [2];
  char *local_28;
  
  local_38[0] = *args;
  local_28 = *args_1;
  format_str_00 = to_string_view<char>(*format_str);
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_38;
  args_00.types_ =
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,long,char_const*>
       ::TYPES;
  iVar1 = internal::vformat_to<char>(&buf->super_basic_buffer<char>,format_str_00,args_00);
  return (iterator)iVar1.container;
}

Assistant:

inline typename buffer_context<Char>::type::iterator format_to(
    basic_memory_buffer<Char, SIZE> &buf, const S &format_str,
    const Args &... args) {
  internal::check_format_string<Args...>(format_str);
  typedef typename buffer_context<Char>::type context;
  format_arg_store<context, Args...> as{args...};
  return internal::vformat_to(buf, to_string_view(format_str),
                              basic_format_args<context>(as));
}